

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

sexp_conflict sexp_thread_list(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  long lVar1;
  long in_RDI;
  bool bVar2;
  sexp_conflict ls;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res;
  int *local_38;
  sexp_conflict *local_30;
  undefined8 local_28;
  sexp_conflict local_20 [3];
  long local_8;
  
  local_20[0] = (sexp_conflict)0x43e;
  local_8 = in_RDI;
  memset(&local_30,0,0x10);
  local_30 = local_20;
  local_28 = *(undefined8 *)(local_8 + 0x6080);
  *(sexp_conflict ***)(local_8 + 0x6080) = &local_30;
  local_20[0] = (sexp_conflict)0x23e;
  local_38 = *(int **)(*(long *)(local_8 + 0x28) + 0x160);
  while( true ) {
    bVar2 = false;
    if (((ulong)local_38 & 3) == 0) {
      bVar2 = *local_38 == 6;
    }
    if (!bVar2) break;
    sexp_push_op(local_8,local_20,*(undefined8 *)(local_38 + 2));
    local_38 = *(int **)(local_38 + 4);
  }
  local_38 = *(int **)(*(long *)(local_8 + 0x28) + 0x170);
  while( true ) {
    bVar2 = false;
    if (((ulong)local_38 & 3) == 0) {
      bVar2 = *local_38 == 6;
    }
    if (!bVar2) break;
    sexp_push_op(local_8,local_20,*(undefined8 *)(local_38 + 2));
    local_38 = *(int **)(local_38 + 4);
  }
  lVar1 = sexp_memq_op(local_8,0,2,local_8,local_20[0]);
  if (lVar1 == 0x3e) {
    sexp_push_op(local_8,local_20,local_8);
  }
  *(undefined8 *)(local_8 + 0x6080) = local_28;
  return local_20[0];
}

Assistant:

sexp sexp_thread_list (sexp ctx, sexp self, sexp_sint_t n) {
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = SEXP_NULL;
#if SEXP_USE_GREEN_THREADS
  sexp ls;
  for (ls=sexp_global(ctx, SEXP_G_THREADS_FRONT); sexp_pairp(ls); ls=sexp_cdr(ls))
    sexp_push(ctx, res, sexp_car(ls));
  for (ls=sexp_global(ctx, SEXP_G_THREADS_PAUSED); sexp_pairp(ls); ls=sexp_cdr(ls))
    sexp_push(ctx, res, sexp_car(ls));
#endif
  if (sexp_not(sexp_memq(ctx, ctx, res))) sexp_push(ctx, res, ctx);
  sexp_gc_release1(ctx);
  return res;
}